

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Performance::TextureUploadCallCase::render(TextureUploadCallCase *this)

{
  UploadFunction UVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  
  iVar4 = (*((this->super_TextureUploadCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  UVar1 = (this->super_TextureUploadCase).m_uploadFunction;
  if (UVar1 == UPLOAD_TEXSUBIMAGE2D) {
    iVar2 = (this->super_TextureUploadCase).m_texSize;
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x13b8))
              (0xde1,0,0,0,iVar2,iVar2,(this->super_TextureUploadCase).m_format,
               (this->super_TextureUploadCase).m_type,
               (this->super_TextureUploadCase).m_texData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  else if (UVar1 == UPLOAD_TEXIMAGE2D) {
    iVar2 = (this->super_TextureUploadCase).m_texSize;
    dVar3 = (this->super_TextureUploadCase).m_format;
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x1310))
              (0xde1,0,dVar3,iVar2,iVar2,0,dVar3,(this->super_TextureUploadCase).m_type,
               (this->super_TextureUploadCase).m_texData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureUploadCallCase::render (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Draw multiple quads to ensure enough workload

	switch (m_uploadFunction)
	{
		case UPLOAD_TEXIMAGE2D:
			gl.texImage2D(GL_TEXTURE_2D, 0, m_format, m_texSize, m_texSize, 0, m_format, m_type, &m_texData[0]);
			break;
		case UPLOAD_TEXSUBIMAGE2D:
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, m_texSize, m_texSize, m_format, m_type, &m_texData[0]);
			break;
		default:
			DE_ASSERT(false);
	}
}